

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  curl_slist *pcVar4;
  char *pcVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  char in_AL;
  int iVar9;
  long *plVar10;
  char *pcVar11;
  long *plVar12;
  void **ppvVar13;
  char *pcVar14;
  size_t sVar15;
  curl_httppost *pcVar16;
  size_t sVar17;
  curl_httppost *pcVar18;
  uint uVar19;
  undefined8 in_RCX;
  ulong uVar20;
  curl_httppost **ppcVar21;
  undefined8 in_RDX;
  CURLFORMcode CVar22;
  size_t sVar23;
  undefined8 in_R8;
  long *plVar24;
  undefined8 in_R9;
  int *piVar25;
  FormInfo *ptr_1;
  FormInfo *ptr;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_150;
  char *local_148;
  char *local_140;
  ulong local_138;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar19 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar10 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar14 = (char *)0x0;
  piVar25 = (int *)0x0;
  CVar22 = CURL_FORMADD_OK;
  plVar24 = plVar10;
  bVar7 = false;
switchD_0013776c_caseD_9:
  plVar12 = plVar10;
  if (CVar22 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar7)) goto code_r0x00137708;
    uVar20 = (ulong)uVar19;
    if (uVar20 < 0x29) {
      uVar19 = uVar19 + 8;
      ppvVar13 = (void **)((long)local_e8 + uVar20);
    }
    else {
      ppvVar13 = local_160;
      local_160 = local_160 + 1;
    }
    iVar9 = *(int *)ppvVar13;
    if (iVar9 != 0x11) goto LAB_00137759;
    local_150 = (char *)0x0;
    plVar24 = plVar10;
    pcVar18 = (curl_httppost *)0x0;
    goto LAB_00137f17;
  }
  do {
    if ((char)plVar12[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar12);
      *plVar12 = 0;
      *(undefined1 *)(plVar12 + 1) = 0;
    }
    if ((char)plVar12[4] == '\x01') {
      (*Curl_cfree)((void *)plVar12[3]);
      plVar12[3] = 0;
      *(undefined1 *)(plVar12 + 4) = 0;
    }
    if ((char)plVar12[7] == '\x01') {
      (*Curl_cfree)((void *)plVar12[6]);
      plVar12[6] = 0;
      *(undefined1 *)(plVar12 + 7) = 0;
    }
    if ((char)plVar12[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar12[0xb]);
      plVar12[0xb] = 0;
      *(undefined1 *)(plVar12 + 0xc) = 0;
    }
    plVar24 = plVar12 + 0xf;
    plVar12 = (long *)*plVar24;
  } while ((long *)*plVar24 != (long *)0x0);
  goto LAB_00137edb;
code_r0x00137708:
  iVar9 = *piVar25;
  pcVar14 = *(char **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar22 = CURL_FORMADD_OK;
  bVar7 = false;
  if (iVar9 == 0x11) goto switchD_0013776c_caseD_9;
  bVar7 = true;
LAB_00137759:
  CVar22 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar11 = pcVar14;
  switch(iVar9) {
  case 2:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 4;
  case 1:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar24 == 0) {
      if (!bVar7) {
        uVar20 = (ulong)uVar19;
        if (uVar20 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar20);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      CVar22 = CURL_FORMADD_NULL;
      if (pcVar11 != (char *)0x0) {
        *plVar24 = (long)pcVar11;
        CVar22 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0013776c_caseD_9;
  case 3:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[2] == 0) {
      if (!bVar7) {
        uVar20 = (ulong)uVar19;
        if (uVar20 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar20);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      plVar24[2] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_0013776c_caseD_9;
  case 5:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 8;
  case 4:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[3] != 0) goto switchD_0013776c_caseD_9;
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    break;
  case 7:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar24 + 8) & 10) != 0) goto switchD_0013776c_caseD_9;
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    pcVar11 = (*Curl_cstrdup)(pcVar11);
    plVar24[3] = (long)pcVar11;
    CVar22 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 2;
    goto LAB_00137e39;
  case 8:
    CVar22 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar8 = !bVar7;
    bVar7 = true;
    if (bVar8) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      piVar25 = (int *)*ppvVar13;
      bVar7 = piVar25 != (int *)0x0;
      CVar22 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_0013776c_caseD_9;
  case 10:
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    if (plVar24[3] != 0) {
      CVar22 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar24 + 8) & 1) == 0) ||
         (CVar22 = CURL_FORMADD_NULL, pcVar11 == (char *)0x0)) goto switchD_0013776c_caseD_9;
      local_148 = (*Curl_cstrdup)(pcVar11);
      CVar22 = CURL_FORMADD_MEMORY;
      if (local_148 == (char *)0x0) goto switchD_0013776c_caseD_9;
      plVar12 = (long *)(*Curl_ccalloc)(1,0x80);
      if (plVar12 == (long *)0x0) goto LAB_00137e45;
      plVar12[3] = (long)local_148;
      plVar12[8] = 1;
      plVar12[0xf] = plVar24[0xf];
      plVar24[0xf] = (long)plVar12;
      *(undefined1 *)(plVar12 + 4) = 1;
      goto LAB_00137c4b;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    pcVar11 = (*Curl_cstrdup)(pcVar11);
    plVar24[3] = (long)pcVar11;
    CVar22 = CURL_FORMADD_MEMORY;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 1;
LAB_00137e39:
    *(undefined1 *)(plVar24 + 4) = 1;
    CVar22 = CURL_FORMADD_OK;
    goto switchD_0013776c_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xb] == 0) {
      pcVar11 = (*Curl_cstrdup)(pcVar11);
      plVar24[0xb] = (long)pcVar11;
      CVar22 = CURL_FORMADD_MEMORY;
      if (pcVar11 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 0xc) = 1;
        CVar22 = CURL_FORMADD_OK;
      }
    }
    goto switchD_0013776c_caseD_9;
  case 0xc:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x30;
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[9] != 0) goto switchD_0013776c_caseD_9;
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    plVar24[9] = (long)pcVar11;
    break;
  case 0xd:
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[10] == 0) {
      if (!bVar7) {
        uVar20 = (ulong)uVar19;
        if (uVar20 < 0x29) {
          uVar19 = uVar19 + 8;
          ppvVar13 = (void **)((long)local_e8 + uVar20);
        }
        else {
          ppvVar13 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar11 = (char *)*ppvVar13;
      }
      plVar24[10] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_0013776c_caseD_9;
  case 0xe:
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    if (plVar24[6] == 0) {
      CVar22 = CURL_FORMADD_NULL;
      if (pcVar11 != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pcVar11);
        plVar24[6] = (long)pcVar11;
        CVar22 = CURL_FORMADD_MEMORY;
        if (pcVar11 != (char *)0x0) {
          *(undefined1 *)(plVar24 + 7) = 1;
          CVar22 = CURL_FORMADD_OK;
        }
      }
      goto switchD_0013776c_caseD_9;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar24 + 8) & 1) == 0) || (CVar22 = CURL_FORMADD_NULL, pcVar11 == (char *)0x0))
    goto switchD_0013776c_caseD_9;
    local_148 = (*Curl_cstrdup)(pcVar11);
    CVar22 = CURL_FORMADD_MEMORY;
    if (local_148 == (char *)0x0) goto switchD_0013776c_caseD_9;
    plVar12 = (long *)(*Curl_ccalloc)(1,0x80);
    if (plVar12 == (long *)0x0) {
LAB_00137e45:
      CVar22 = CURL_FORMADD_MEMORY;
      (*Curl_cfree)(local_148);
      goto switchD_0013776c_caseD_9;
    }
    plVar12[6] = (long)local_148;
    plVar12[8] = 1;
    plVar12[0xf] = plVar24[0xf];
    plVar24[0xf] = (long)plVar12;
    *(undefined1 *)(plVar12 + 7) = 1;
LAB_00137c4b:
    CVar22 = CURL_FORMADD_OK;
    plVar24 = plVar12;
    goto switchD_0013776c_caseD_9;
  case 0xf:
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xe] == 0) {
      plVar24[0xe] = (long)pcVar11;
      CVar22 = CURL_FORMADD_OK;
    }
    goto switchD_0013776c_caseD_9;
  case 0x13:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x40;
    CVar22 = CURL_FORMADD_OPTION_TWICE;
    if (plVar24[0xd] != 0) goto switchD_0013776c_caseD_9;
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    CVar22 = CURL_FORMADD_NULL;
    if (pcVar11 == (char *)0x0) goto switchD_0013776c_caseD_9;
    plVar24[0xd] = (long)pcVar11;
    break;
  case 0x14:
    *(byte *)(plVar24 + 8) = *(byte *)(plVar24 + 8) | 0x80;
  case 6:
    if (!bVar7) {
      uVar20 = (ulong)uVar19;
      if (uVar20 < 0x29) {
        uVar19 = uVar19 + 8;
        ppvVar13 = (void **)((long)local_e8 + uVar20);
      }
      else {
        ppvVar13 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar11 = (char *)*ppvVar13;
    }
    plVar24[5] = (long)pcVar11;
    CVar22 = CURL_FORMADD_OK;
    goto switchD_0013776c_caseD_9;
  }
  plVar24[3] = (long)pcVar11;
  CVar22 = CURL_FORMADD_OK;
  goto switchD_0013776c_caseD_9;
LAB_00137f17:
  pcVar14 = (char *)*plVar24;
  if (pcVar14 == (char *)0x0) {
    if (pcVar18 == (curl_httppost *)0x0) goto LAB_00138225;
LAB_00137f37:
    uVar20 = plVar24[8];
    CVar22 = CURL_FORMADD_INCOMPLETE;
    if (((((plVar24[5] != 0 & (byte)uVar20) != 0) || (uVar19 = (uint)uVar20, (uVar19 & 9) == 9)) ||
        ((~uVar19 & 10) == 0)) || ((~uVar19 & 0x30) == 0 && plVar24[9] == 0)) goto LAB_0013822a;
    if (((uVar20 & 0x11) != 0) && (plVar24[6] == 0)) {
      pcVar14 = Curl_mime_contenttype(*(char **)((long)plVar24 + (ulong)(uVar19 & 0x10) * 4 + 0x18))
      ;
      if (pcVar14 == (char *)0x0) {
        pcVar14 = local_150;
      }
      if (pcVar14 == (char *)0x0) {
        pcVar14 = "application/octet-stream";
      }
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      plVar24[6] = (long)pcVar14;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)(plVar24 + 7) = 1;
        pcVar14 = (char *)*plVar24;
        goto LAB_00137fd5;
      }
LAB_0013821e:
      CVar22 = CURL_FORMADD_MEMORY;
      goto LAB_0013822a;
    }
LAB_00137fd5:
    if (pcVar14 == (char *)0x0) {
      local_138 = plVar24[8];
      if (plVar24 != plVar10 || (local_138 & 4) != 0) {
        pcVar14 = (char *)0x0;
        goto LAB_0013806e;
      }
      goto LAB_0013821e;
    }
    sVar23 = plVar24[2];
    if (sVar23 == 0) {
      local_138 = plVar24[8];
      if (plVar24 == plVar10 && (local_138 & 4) == 0) {
        sVar17 = strlen(pcVar14);
        sVar23 = sVar17 + 1;
        goto LAB_0013804d;
      }
    }
    else {
      sVar15 = 0;
      do {
        if (pcVar14[sVar15] == '\0') {
          CVar22 = CURL_FORMADD_NULL;
          goto LAB_0013822a;
        }
        sVar15 = sVar15 + 1;
      } while (sVar23 != sVar15);
      local_138 = plVar24[8];
      if (plVar24 == plVar10 && (local_138 & 4) == 0) {
LAB_0013804d:
        pcVar14 = (char *)Curl_memdup(pcVar14,sVar23);
        *plVar24 = (long)pcVar14;
        if (pcVar14 == (char *)0x0) goto LAB_0013821e;
        *(undefined1 *)(plVar24 + 1) = 1;
        local_138 = plVar24[8];
      }
    }
LAB_0013806e:
    local_140 = (char *)plVar24[3];
    if ((local_138 & 0x6b) == 0) {
      if (local_140 == (char *)0x0) {
        local_140 = (char *)0x0;
      }
      else {
        sVar23 = plVar24[5];
        if (sVar23 == 0) {
          sVar17 = strlen(local_140);
          sVar23 = sVar17 + 1;
        }
        local_140 = (char *)Curl_memdup(local_140,sVar23);
        plVar24[3] = (long)local_140;
        if (local_140 == (char *)0x0) goto LAB_0013821e;
        *(undefined1 *)(plVar24 + 4) = 1;
        pcVar14 = (char *)*plVar24;
        local_138 = plVar24[8];
      }
    }
    sVar17 = plVar24[2];
    lVar1 = plVar24[5];
    pcVar11 = (char *)plVar24[9];
    lVar2 = plVar24[10];
    pcVar3 = (char *)plVar24[6];
    pcVar4 = (curl_slist *)plVar24[0xe];
    pcVar5 = (char *)plVar24[0xb];
    pvVar6 = (void *)plVar24[0xd];
    pcVar16 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
    if (pcVar16 == (curl_httppost *)0x0) goto LAB_0013821e;
    pcVar16->name = pcVar14;
    if (pcVar14 == (char *)0x0) {
      sVar17 = 0;
    }
    else if (sVar17 == 0) {
      sVar17 = strlen(pcVar14);
    }
    pcVar16->namelength = sVar17;
    pcVar16->contents = local_140;
    pcVar16->contentlen = lVar1;
    pcVar16->buffer = pcVar11;
    pcVar16->bufferlength = lVar2;
    pcVar16->contenttype = pcVar3;
    pcVar16->contentheader = pcVar4;
    pcVar16->showfilename = pcVar5;
    pcVar16->userp = pvVar6;
    pcVar16->flags = local_138 | 0x80;
    if (pcVar18 == (curl_httppost *)0x0) {
      pcVar18 = *last_post;
      if (*last_post == (curl_httppost *)0x0) {
        pcVar18 = (curl_httppost *)httppost;
      }
      pcVar18->next = pcVar16;
      ppcVar21 = last_post;
    }
    else {
      pcVar16->more = pcVar18->more;
      ppcVar21 = &pcVar18->more;
    }
    *ppcVar21 = pcVar16;
    if ((char *)plVar24[6] != (char *)0x0) {
      local_150 = (char *)plVar24[6];
    }
    plVar24 = (long *)plVar24[0xf];
    CVar22 = CURL_FORMADD_OK;
    pcVar18 = pcVar16;
    if (plVar24 == (long *)0x0) goto LAB_00137edb;
    goto LAB_00137f17;
  }
  if (plVar24[3] != 0 || pcVar18 != (curl_httppost *)0x0) goto LAB_00137f37;
LAB_00138225:
  CVar22 = CURL_FORMADD_INCOMPLETE;
LAB_0013822a:
  do {
    if ((char)plVar24[1] == '\x01') {
      (*Curl_cfree)((void *)*plVar24);
      *plVar24 = 0;
      *(undefined1 *)(plVar24 + 1) = 0;
    }
    if ((char)plVar24[4] == '\x01') {
      (*Curl_cfree)((void *)plVar24[3]);
      plVar24[3] = 0;
      *(undefined1 *)(plVar24 + 4) = 0;
    }
    if ((char)plVar24[7] == '\x01') {
      (*Curl_cfree)((void *)plVar24[6]);
      plVar24[6] = 0;
      *(undefined1 *)(plVar24 + 7) = 0;
    }
    if ((char)plVar24[0xc] == '\x01') {
      (*Curl_cfree)((void *)plVar24[0xb]);
      plVar24[0xb] = 0;
      *(undefined1 *)(plVar24 + 0xc) = 0;
    }
    plVar24 = (long *)plVar24[0xf];
  } while (plVar24 != (long *)0x0);
LAB_00137edb:
  do {
    plVar24 = (long *)plVar10[0xf];
    (*Curl_cfree)(plVar10);
    plVar10 = plVar24;
  } while (plVar24 != (long *)0x0);
  return CVar22;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}